

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O2

char * Abc_NtkTestScorrGetName(Abc_Ntk_t *pNetlist,Vec_Int_t *vId2Name,int Id)

{
  Nm_Man_t *p;
  int iVar1;
  char *pcVar2;
  
  iVar1 = Vec_IntEntry(vId2Name,Id);
  if (iVar1 != -1) {
    p = pNetlist->pManName;
    iVar1 = Vec_IntEntry(vId2Name,Id);
    pcVar2 = Nm_ManFindNameById(p,iVar1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char * Abc_NtkTestScorrGetName( Abc_Ntk_t * pNetlist, Vec_Int_t * vId2Name, int Id )
{
//    Abc_Obj_t * pObj;
//printf( "trying to get name for %d\n", Id );
    if ( Vec_IntEntry(vId2Name, Id) == ~0 )
        return NULL;
//    pObj = Abc_NtkObj( pNetlist, Vec_IntEntry(vId2Name, Id) );
//    pObj = Abc_ObjFanin0(pObj);
//    assert( Abc_ObjIsCi(pObj) );
    return Nm_ManFindNameById( pNetlist->pManName, Vec_IntEntry(vId2Name, Id) );
}